

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O2

void GEN_CS::gen_cs_example<false>(cb_to_cs *c,example *ec,label *ld,label *cs_ld)

{
  size_t sVar1;
  ostream *poVar2;
  vw_exception *this;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  sVar1 = c->cb_type;
  if (sVar1 == 0) {
    gen_cs_example_dr<false>(c,ec,ld,cs_ld);
    return;
  }
  if (sVar1 != 1) {
    if (sVar1 == 2) {
      gen_cs_example_ips(c,ld,cs_ld);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar2 = std::operator<<(&local_190,"Unknown cb_type specified for contextual bandit learning: "
                            );
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gen_cs_example.h"
               ,0xb5,&local_1c0);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  gen_cs_example_dm<false>(c,ec,cs_ld);
  return;
}

Assistant:

void gen_cs_example(cb_to_cs& c, example& ec, CB::label& ld, COST_SENSITIVE::label& cs_ld)
{
  switch (c.cb_type)
  {
    case CB_TYPE_IPS:
      gen_cs_example_ips(c, ld, cs_ld);
      break;
    case CB_TYPE_DM:
      gen_cs_example_dm<is_learn>(c, ec, cs_ld);
      break;
    case CB_TYPE_DR:
      gen_cs_example_dr<is_learn>(c, ec, ld, cs_ld);
      break;
    default:
      THROW("Unknown cb_type specified for contextual bandit learning: " << c.cb_type);
  }
}